

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

int __thiscall
ot::commissioner::UdpSocket::Connect(UdpSocket *this,string *aPeerAddr,uint16_t aPeerPort)

{
  event *ev;
  undefined1 *ctx;
  int iVar1;
  undefined6 in_register_00000012;
  string portStr;
  
  std::__cxx11::to_string(&portStr,(int)CONCAT62(in_register_00000012,aPeerPort));
  ctx = &(this->super_Socket).field_0xb4;
  mbedtls_net_free((mbedtls_net_context *)ctx);
  ev = &(this->super_Socket).mEvent;
  if ((this->super_Socket).mEvent.ev_base != (event_base *)0x0) {
    event_del(ev);
  }
  iVar1 = mbedtls_net_connect((mbedtls_net_context *)ctx,(aPeerAddr->_M_dataplus)._M_p,
                              portStr._M_dataplus._M_p,1);
  if (iVar1 == 0) {
    iVar1 = mbedtls_net_set_nonblock((mbedtls_net_context *)ctx);
    if (iVar1 == 0) {
      iVar1 = event_assign(ev,(this->super_Socket).mEventBase,
                           *(int *)&(this->super_Socket).field_0xb4,0x36,Socket::HandleEvent,this);
      if (iVar1 == 0) {
        iVar1 = event_add(ev,(timeval *)0x0);
        if (iVar1 == 0) {
          (this->super_Socket).mIsConnected = true;
          iVar1 = 0;
          goto LAB_001b8757;
        }
      }
    }
  }
  mbedtls_net_free((mbedtls_net_context *)ctx);
LAB_001b8757:
  std::__cxx11::string::~string((string *)&portStr);
  return iVar1;
}

Assistant:

int UdpSocket::Connect(const std::string &aPeerAddr, uint16_t aPeerPort)
{
    auto portStr = std::to_string(aPeerPort);

    // Free the fd if already opened.
    mbedtls_net_free(&mNetCtx);
    if (mEvent.ev_base != nullptr)
    {
        event_del(&mEvent);
    }

    // Connect
    int rval = mbedtls_net_connect(&mNetCtx, aPeerAddr.c_str(), portStr.c_str(), MBEDTLS_NET_PROTO_UDP);
    VerifyOrExit(rval == 0);
    VerifyOrExit((rval = mbedtls_net_set_nonblock(&mNetCtx)) == 0);

    // Setup event
    rval = event_assign(&mEvent, mEventBase, mNetCtx.fd, EV_PERSIST | EV_READ | EV_WRITE | EV_ET, HandleEvent, this);
    VerifyOrExit(rval == 0);
    VerifyOrExit((rval = event_add(&mEvent, nullptr)) == 0);

exit:
    if (rval != 0)
    {
        mbedtls_net_free(&mNetCtx);
    }
    else
    {
        mIsConnected = true;
    }
    return rval;
}